

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *customStep,cmGeneratorTarget *target)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 local_2a8 [8];
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ofstream script;
  string local_58;
  byte local_31;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *target_local;
  string *customStep_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLines_local;
  cmLocalNinjaGenerator *this_local;
  string *scriptPath;
  
  local_31 = 0;
  local_30 = target;
  target_local = (cmGeneratorTarget *)customStep;
  customStep_local = (string *)cmdLines;
  cmdLines_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_30 == (cmGeneratorTarget *)0x0) {
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/CMakeFiles");
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_58,local_30);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".sh");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&__range1,pcVar3,_S_out);
  std::operator<<((ostream *)&__range1,"set -e\n\n");
  psVar2 = customStep_local;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)customStep_local);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) break;
    cmd.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_2a8,(string *)cmd.field_2._8_8_);
    cmsys::SystemTools::ReplaceString((string *)local_2a8,"$$","$");
    poVar4 = std::operator<<((ostream *)&__range1,(string *)local_2a8);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)local_2a8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_31 = 1;
  std::ofstream::~ofstream(&__range1);
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = this->GetCurrentBinaryDirectory();
    scriptPath += "/CMakeFiles";
  }
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}